

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

ArgInfo * __thiscall
SoapySDR::Device::getSettingInfo(Device *this,int direction,size_t channel,string *key)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator cVar2;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  this_01;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  ArgInfo *in_RDI;
  ArgInfo *in_R8;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  argInfoIter;
  ArgInfoList allArgInfos;
  ArgInfo *__lhs;
  anon_class_8_1_ba1d59bf_for__M_pred in_stack_ffffffffffffff88;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  local_48;
  undefined1 local_40 [24];
  ArgInfo *local_28;
  
  __lhs = in_RDI;
  local_28 = in_R8;
  (**(code **)(*in_RSI + 0x340))(local_40,in_RSI,in_EDX,in_RCX);
  this_00 = std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::begin(in_RDI);
  cVar2 = std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::end(in_RDI);
  this_01 = std::
            find_if<__gnu_cxx::__normal_iterator<SoapySDR::ArgInfo_const*,std::vector<SoapySDR::ArgInfo,std::allocator<SoapySDR::ArgInfo>>>,SoapySDR::Device::getSettingInfo(int,unsigned_long,std::__cxx11::string_const&)const::__0>
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
  local_48 = this_01;
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::end
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
                      *)__lhs,(__normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
                               *)in_RDI);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
    ::operator*(&local_48);
    ArgInfo::ArgInfo(this_00._M_current,cVar2._M_current);
  }
  else {
    ArgInfo::ArgInfo(local_28);
  }
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)this_01._M_current);
  return __lhs;
}

Assistant:

SoapySDR::ArgInfo SoapySDR::Device::getSettingInfo(const int direction, const size_t channel, const std::string &key) const
{
    const auto allArgInfos = this->getSettingInfo(direction, channel);
    auto argInfoIter = std::find_if(
        allArgInfos.begin(),
        allArgInfos.end(),
        [&key](const SoapySDR::ArgInfo &argInfo)
        {
            return (argInfo.key == key);
        });

    return (argInfoIter != allArgInfos.end()) ? (*argInfoIter) : SoapySDR::ArgInfo();
}